

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int main(int argc,char **argv)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  bool bVar4;
  bool bVar5;
  trico_stream_type tVar6;
  uint32_t nr_of_vertices;
  uint32_t uVar7;
  uint uVar8;
  uint uVar9;
  FILE *__stream;
  uint8_t *data;
  size_t sVar10;
  void *a;
  int iVar11;
  char *pcVar12;
  char *pcVar13;
  ulong uVar14;
  char cVar15;
  uint uVar16;
  ulong uVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  uint32_t *tria_indices;
  float *texcoords;
  uint32_t *vertex_colors;
  float *vertex_normals;
  float *triangle_normals;
  uint16_t *attributes;
  uint8_t *local_4d0;
  float *vertices;
  ulong local_498;
  char new_filename [1024];
  
  if (argc < 3) {
    puts("Usage: trico_decoder -i <input> [options]\n");
    puts("Options:");
    puts("  -i <input>           input file name.");
    puts("  -o <output>          output file name of type stl or ply.");
    putchar(10);
    return -1;
  }
  iVar11 = 1;
  bVar4 = false;
  pcVar13 = (char *)0x0;
  do {
    pcVar12 = argv[iVar11];
    if (*pcVar12 != '-') {
LAB_0010bd5e:
      pcVar13 = "Unknown command %s\n";
      goto LAB_0010bd68;
    }
    if ((pcVar12[1] == 'i') && (pcVar12[2] == '\0')) {
      if (iVar11 == argc + -1) {
        pcVar13 = "I expect a filename after command -i";
        goto LAB_0010bffc;
      }
      pcVar12 = argv[(long)iVar11 + 1];
    }
    else {
      if ((pcVar12[1] != 'o') || (pcVar12[2] != '\0')) goto LAB_0010bd5e;
      if (iVar11 == argc + -1) {
        pcVar13 = "I expect a filename after command -o";
        goto LAB_0010bffc;
      }
      pcVar12 = argv[(long)iVar11 + 1];
      cVar15 = *pcVar12;
      if (cVar15 == '\0') {
        uVar17 = 0;
      }
      else {
        uVar17 = 0;
        do {
          new_filename[uVar17] = cVar15;
          cVar15 = pcVar12[uVar17 + 1];
          uVar17 = uVar17 + 1;
        } while (cVar15 != '\0');
        uVar17 = uVar17 & 0xffffffff;
      }
      new_filename[uVar17] = '\0';
      bVar4 = true;
      pcVar12 = pcVar13;
    }
    iVar11 = iVar11 + 2;
    pcVar13 = pcVar12;
  } while (iVar11 < argc);
  if (pcVar12 == (char *)0x0) {
    pcVar13 = "An input file name is required";
LAB_0010bffc:
    puts(pcVar13);
    return -1;
  }
  iVar11 = stat(pcVar12,(stat *)&vertices);
  uVar17 = -(ulong)(iVar11 != 0) | local_498;
  if ((long)uVar17 < 0) {
    pcVar13 = "There was an error reading file %s\n";
  }
  else {
    __stream = fopen(pcVar12,"rb");
    if (__stream == (FILE *)0x0) {
      pcVar13 = "Cannot open file: %s\n";
    }
    else {
      data = (uint8_t *)malloc(uVar17);
      sVar10 = fread(data,1,uVar17,__stream);
      if (sVar10 != uVar17) {
        printf("There was an error reading file %s\n",pcVar12);
        fclose(__stream);
        return -1;
      }
      fclose(__stream);
      a = trico_open_archive_for_reading(data,uVar17);
      if (a != (void *)0x0) {
        uVar17 = 0;
        vertices = (float *)0x0;
        tria_indices = (uint32_t *)0x0;
        triangle_normals = (float *)0x0;
        vertex_normals = (float *)0x0;
        vertex_colors = (uint32_t *)0x0;
        texcoords = (float *)0x0;
        attributes = (uint16_t *)0x0;
        local_4d0 = data;
        tVar6 = trico_get_next_stream_type(a);
        nr_of_vertices = 0;
        do {
          switch(tVar6) {
          case trico_empty:
            goto switchD_0010be60_caseD_0;
          case trico_vertex_float_stream:
            nr_of_vertices = trico_get_number_of_vertices(a);
            vertices = (float *)malloc((ulong)(nr_of_vertices * 3) << 2);
            iVar11 = trico_read_vertices(a,&vertices);
            if (iVar11 == 0) {
              free(vertices);
              free(triangle_normals);
              free(vertex_normals);
              free(vertex_colors);
              free(texcoords);
              free(tria_indices);
              free(attributes);
              trico_close_archive(a);
              free(local_4d0);
              pcVar13 = "Something went wrong when reading the vertices";
              goto LAB_0010bffc;
            }
            break;
          default:
            trico_skip_next_stream(a);
            break;
          case trico_triangle_uint32_stream:
            uVar7 = trico_get_number_of_triangles(a);
            uVar17 = (ulong)uVar7;
            tria_indices = (uint32_t *)malloc((ulong)(uVar7 * 3) << 2);
            iVar11 = trico_read_triangles(a,&tria_indices);
            if (iVar11 == 0) {
              free(vertices);
              free(triangle_normals);
              free(vertex_normals);
              free(vertex_colors);
              free(texcoords);
              free(tria_indices);
              free(attributes);
              trico_close_archive(a);
              free(local_4d0);
              pcVar13 = "Something went wrong when reading the triangles";
              goto LAB_0010bffc;
            }
            break;
          case trico_uv_per_triangle_float_stream:
            uVar7 = trico_get_number_of_uvs(a);
            texcoords = (float *)malloc((ulong)(uVar7 * 2) << 2);
            iVar11 = trico_read_uv_per_triangle(a,&texcoords);
            if (iVar11 == 0) {
              free(vertices);
              free(triangle_normals);
              free(vertex_normals);
              free(vertex_colors);
              free(texcoords);
              free(tria_indices);
              free(attributes);
              trico_close_archive(a);
              free(local_4d0);
              pcVar13 = "Something went wrong when reading the texture coordinates";
              goto LAB_0010bffc;
            }
            break;
          case trico_vertex_normal_float_stream:
            uVar7 = trico_get_number_of_normals(a);
            vertex_normals = (float *)malloc((ulong)(uVar7 * 3) << 2);
            iVar11 = trico_read_vertex_normals(a,&vertex_normals);
            if (iVar11 == 0) {
              free(vertices);
              free(triangle_normals);
              free(vertex_normals);
              free(vertex_colors);
              free(texcoords);
              free(tria_indices);
              free(attributes);
              trico_close_archive(a);
              free(local_4d0);
              pcVar13 = "Something went wrong when reading the vertex normals";
              goto LAB_0010bffc;
            }
            break;
          case trico_triangle_normal_float_stream:
            uVar7 = trico_get_number_of_normals(a);
            triangle_normals = (float *)malloc((ulong)(uVar7 * 3) << 2);
            iVar11 = trico_read_triangle_normals(a,&triangle_normals);
            if (iVar11 == 0) {
              free(vertices);
              free(triangle_normals);
              free(vertex_normals);
              free(vertex_colors);
              free(texcoords);
              free(tria_indices);
              free(attributes);
              trico_close_archive(a);
              free(local_4d0);
              pcVar13 = "Something went wrong when reading the triangle normals";
              goto LAB_0010bffc;
            }
            break;
          case trico_vertex_color_stream:
            uVar7 = trico_get_number_of_colors(a);
            vertex_colors = (uint32_t *)malloc((ulong)uVar7 << 2);
            iVar11 = trico_read_vertex_colors(a,&vertex_colors);
            if (iVar11 == 0) {
              free(vertices);
              free(triangle_normals);
              free(vertex_normals);
              free(vertex_colors);
              free(texcoords);
              free(tria_indices);
              free(attributes);
              trico_close_archive(a);
              free(local_4d0);
              pcVar13 = "Something went wrong when reading the vertex colors";
              goto LAB_0010bffc;
            }
            break;
          case trico_attribute_uint16_stream:
            uVar7 = trico_get_number_of_attributes(a);
            attributes = (uint16_t *)malloc((ulong)uVar7 * 2);
            iVar11 = trico_read_attributes_uint16(a,&attributes);
            if (iVar11 == 0) {
              free(vertices);
              free(triangle_normals);
              free(vertex_normals);
              free(vertex_colors);
              free(texcoords);
              free(tria_indices);
              free(attributes);
              trico_close_archive(a);
              free(local_4d0);
              pcVar13 = "Something went wrong when reading the attributes";
              goto LAB_0010bffc;
            }
          }
          tVar6 = trico_get_next_stream_type(a);
        } while( true );
      }
      pcVar13 = "The input file %s is not a trico archive.\n";
    }
  }
  goto LAB_0010bd68;
switchD_0010be60_caseD_0:
  trico_close_archive(a);
  free(local_4d0);
  if (bVar4) {
    uVar8 = extension_is_stl(new_filename);
    uVar9 = extension_is_ply(new_filename);
  }
  else {
    uVar9 = 0;
    uVar8 = 0;
  }
  if (uVar8 == 0 && uVar9 == 0) {
    uVar8 = (uint)((texcoords == (float *)0x0 && vertex_colors == (uint32_t *)0x0) &&
                  vertex_normals == (float *)0x0);
    uVar9 = (uint)((texcoords != (float *)0x0 || vertex_colors != (uint32_t *)0x0) ||
                  vertex_normals != (float *)0x0);
  }
  if (!bVar4) {
    if (uVar9 == 0) {
      change_extension_to_stl(new_filename,pcVar12);
    }
    else {
      change_extension_to_ply(new_filename,pcVar12);
    }
  }
  uVar7 = (uint32_t)uVar17;
  if (triangle_normals == (float *)0x0 && uVar8 != 0) {
    triangle_normals = (float *)malloc((ulong)(uVar7 * 3) << 2);
    if (uVar7 != 0) {
      uVar14 = 0;
      do {
        uVar1 = tria_indices[uVar14 & 0xffffffff];
        uVar16 = (int)uVar14 + 1;
        uVar2 = tria_indices[uVar16];
        uVar9 = (int)uVar14 + 2;
        uVar3 = tria_indices[uVar9];
        fVar20 = vertices[uVar2 * 3] - vertices[uVar1 * 3];
        fVar22 = vertices[uVar2 * 3 + 1] - vertices[uVar1 * 3 + 1];
        fVar19 = vertices[uVar2 * 3 + 2] - vertices[uVar1 * 3 + 2];
        fVar21 = vertices[uVar3 * 3] - vertices[uVar1 * 3];
        fVar18 = vertices[uVar3 * 3 + 1] - vertices[uVar1 * 3 + 1];
        fVar24 = vertices[uVar3 * 3 + 2] - vertices[uVar1 * 3 + 2];
        fVar23 = fVar22 * fVar24 - fVar18 * fVar19;
        fVar24 = fVar19 * fVar21 - fVar24 * fVar20;
        fVar19 = fVar18 * fVar20 - fVar21 * fVar22;
        fVar20 = SQRT(fVar19 * fVar19 + fVar23 * fVar23 + fVar24 * fVar24);
        bVar4 = NAN(fVar20);
        bVar5 = fVar20 == 0.0;
        fVar18 = fVar23 / fVar20;
        if ((bVar5) && (!bVar4)) {
          fVar18 = fVar23;
        }
        triangle_normals[uVar14 & 0xffffffff] = fVar18;
        fVar18 = fVar24 / fVar20;
        if ((bVar5) && (!bVar4)) {
          fVar18 = fVar24;
        }
        triangle_normals[uVar16] = fVar18;
        fVar18 = fVar19 / fVar20;
        if ((bVar5) && (!bVar4)) {
          fVar18 = fVar19;
        }
        triangle_normals[uVar9] = fVar18;
        uVar14 = uVar14 + 3;
      } while (uVar17 * 3 != uVar14);
      goto LAB_0010c4fb;
    }
LAB_0010c4ff:
    iVar11 = trico_write_stl(vertices,tria_indices,uVar7,triangle_normals,attributes,new_filename);
  }
  else {
LAB_0010c4fb:
    if (uVar8 != 0) goto LAB_0010c4ff;
    iVar11 = trico_write_ply(nr_of_vertices,vertices,vertex_normals,vertex_colors,uVar7,tria_indices
                             ,texcoords,new_filename);
  }
  if (iVar11 != 0) {
    free(vertices);
    free(triangle_normals);
    free(vertex_normals);
    free(vertex_colors);
    free(texcoords);
    free(tria_indices);
    free(attributes);
    return 0;
  }
  pcVar13 = "Could not write to %s\n";
  pcVar12 = new_filename;
LAB_0010bd68:
  printf(pcVar13,pcVar12);
  return -1;
}

Assistant:

int main(int argc, const char** argv)
  {
  if (argc < 3)
    {
    print_help();
    return -1;
    }
  const char* filename = NULL;
  int output_filename = 0;
  char new_filename[1024];
  for (int j = 1; j < argc; ++j)
    {
    if (strcmp(argv[j], "-i") == 0)
      {
      if (j == argc - 1)
        {
        printf("I expect a filename after command -i\n");
        return -1;
        }
      ++j;
      filename = argv[j];
      }
    else if (strcmp(argv[j], "-o") == 0)
      {
      if (j == argc - 1)
        {
        printf("I expect a filename after command -o\n");
        return -1;
        }
      ++j;
      const char* ptr = argv[j];
      int idx = 0;
      while (*ptr)
        new_filename[idx++] = *ptr++;
      new_filename[idx] = 0;
      output_filename = 1;
      }
    else
      {
      printf("Unknown command %s\n", argv[j]);
      return -1;
      }
    }

  if (!filename)
    {
    printf("An input file name is required\n");
    return -1;
    }


  long long size = fsize(filename);
  if (size < 0)
    {
    printf("There was an error reading file %s\n", filename);
    return -1;
    }

  FILE* f = fopen(filename, "rb");
  if (!f)
    {
    printf("Cannot open file: %s\n", filename);
    return -1;
    }
  char* buffer = (char*)malloc(size);
  long long fl = (long long)fread(buffer, 1, size, f);
  if (fl != size)
    {
    printf("There was an error reading file %s\n", filename);
    fclose(f);
    return -1;
    }
  fclose(f);

  void* arch = trico_open_archive_for_reading((const uint8_t*)buffer, size);
  if (!arch)
    {
    printf("The input file %s is not a trico archive.\n", filename);
    return -1;
    }

  float* vertices = NULL;
  uint32_t* tria_indices = NULL;
  float* triangle_normals = NULL;
  float* vertex_normals = NULL;
  uint32_t* vertex_colors = NULL;
  float* texcoords = NULL;
  uint16_t* attributes = NULL;
  uint32_t nr_of_vertices = 0;
  uint32_t nr_of_triangles = 0;
  uint32_t nr_of_triangle_normals = 0;
  uint32_t nr_of_vertex_normals = 0;
  uint32_t nr_of_vertex_colors = 0;
  uint32_t nr_of_texcoords = 0;
  uint32_t nr_of_attributes = 0;

  enum trico_stream_type st = trico_get_next_stream_type(arch);
  while (!st == trico_empty)
    {
    switch (st)
      {
      case trico_vertex_float_stream:
      {
      nr_of_vertices = trico_get_number_of_vertices(arch);
      vertices = (float*)malloc(nr_of_vertices * 3 * sizeof(float));
      if (!trico_read_vertices(arch, &vertices))
        {
        free(vertices);
        free(triangle_normals);
        free(vertex_normals);
        free(vertex_colors);
        free(texcoords);
        free(tria_indices);
        free(attributes);
        trico_close_archive(arch);
        free(buffer);
        printf("Something went wrong when reading the vertices\n");
        return -1;
        }
      break;
      }
      case trico_triangle_normal_float_stream:
      {
      nr_of_triangle_normals = trico_get_number_of_normals(arch);
      triangle_normals = (float*)malloc(nr_of_triangle_normals * 3 * sizeof(float));
      if (!trico_read_triangle_normals(arch, &triangle_normals))
        {
        free(vertices);
        free(triangle_normals);
        free(vertex_normals);
        free(vertex_colors);
        free(texcoords);
        free(tria_indices);
        free(attributes);
        trico_close_archive(arch);
        free(buffer);
        printf("Something went wrong when reading the triangle normals\n");
        return -1;
        }
      break;
      }
      case trico_vertex_normal_float_stream:
      {
      nr_of_vertex_normals = trico_get_number_of_normals(arch);
      vertex_normals = (float*)malloc(nr_of_vertex_normals * 3 * sizeof(float));
      if (!trico_read_vertex_normals(arch, &vertex_normals))
        {
        free(vertices);
        free(triangle_normals);
        free(vertex_normals);
        free(vertex_colors);
        free(texcoords);
        free(tria_indices);
        free(attributes);
        trico_close_archive(arch);
        free(buffer);
        printf("Something went wrong when reading the vertex normals\n");
        return -1;
        }
      break;
      }
      case trico_vertex_color_stream:
      {
      nr_of_vertex_colors = trico_get_number_of_colors(arch);
      vertex_colors = (uint32_t*)malloc(nr_of_vertex_colors * sizeof(uint32_t));
      if (!trico_read_vertex_colors(arch, &vertex_colors))
        {
        free(vertices);
        free(triangle_normals);
        free(vertex_normals);
        free(vertex_colors);
        free(texcoords);
        free(tria_indices);
        free(attributes);
        trico_close_archive(arch);
        free(buffer);
        printf("Something went wrong when reading the vertex colors\n");
        return -1;
        }
      break;
      }
      case trico_triangle_uint32_stream:
      {
      nr_of_triangles = trico_get_number_of_triangles(arch);
      tria_indices = (uint32_t*)malloc(nr_of_triangles * 3 * sizeof(uint32_t));
      if (!trico_read_triangles(arch, &tria_indices))
        {
        free(vertices);
        free(triangle_normals);
        free(vertex_normals);
        free(vertex_colors);
        free(texcoords);
        free(tria_indices);
        free(attributes);
        trico_close_archive(arch);
        free(buffer);
        printf("Something went wrong when reading the triangles\n");
        return -1;
        }
      break;
      }
      case trico_attribute_uint16_stream:
      {
      nr_of_attributes = trico_get_number_of_attributes(arch);
      attributes = (uint16_t*)malloc(nr_of_attributes * sizeof(uint16_t));
      if (!trico_read_attributes_uint16(arch, &attributes))
        {
        free(vertices);
        free(triangle_normals);
        free(vertex_normals);
        free(vertex_colors);
        free(texcoords);
        free(tria_indices);
        free(attributes);
        trico_close_archive(arch);
        free(buffer);
        printf("Something went wrong when reading the attributes\n");
        return -1;
        }
      break;
      }
      case trico_uv_per_triangle_float_stream:
      {
      nr_of_texcoords = trico_get_number_of_uvs(arch);
      texcoords = (float*)malloc(nr_of_texcoords * 2 * sizeof(float));
      if (!trico_read_uv_per_triangle(arch, &texcoords))
        {
        free(vertices);
        free(triangle_normals);
        free(vertex_normals);
        free(vertex_colors);
        free(texcoords);
        free(tria_indices);
        free(attributes);
        trico_close_archive(arch);
        free(buffer);
        printf("Something went wrong when reading the texture coordinates\n");
        return -1;
        }
      break;
      }
      default:
      {
      trico_skip_next_stream(arch);
      break;
      }
      }

    st = trico_get_next_stream_type(arch);
    }

  trico_close_archive(arch);
  free(buffer);

  int output_as_stl = 0;
  int output_as_ply = 0;

  if (output_filename)
    {
    output_as_stl = extension_is_stl(new_filename);
    output_as_ply = extension_is_ply(new_filename);
    }

  if (!output_as_stl && !output_as_ply)
    {
    if (vertex_colors || texcoords || vertex_normals)
      output_as_ply = 1;
    else
      output_as_stl = 1;
    }

  if (!output_filename)
    {
    if (output_as_ply)
      change_extension_to_ply(new_filename, filename);
    else
      change_extension_to_stl(new_filename, filename);
    }

  if (output_as_stl && (triangle_normals == NULL))
    {
    triangle_normals = (float*)malloc(nr_of_triangles * 3 * sizeof(float));
    for (uint32_t t = 0; t < nr_of_triangles; ++t)
      {
      const uint32_t v0 = tria_indices[t * 3];
      const uint32_t v1 = tria_indices[t * 3 + 1];
      const uint32_t v2 = tria_indices[t * 3 + 2];
      const float x0 = vertices[v0 * 3];
      const float y0 = vertices[v0 * 3 + 1];
      const float z0 = vertices[v0 * 3 + 2];
      const float x1 = vertices[v1 * 3];
      const float y1 = vertices[v1 * 3 + 1];
      const float z1 = vertices[v1 * 3 + 2];
      const float x2 = vertices[v2 * 3];
      const float y2 = vertices[v2 * 3 + 1];
      const float z2 = vertices[v2 * 3 + 2];
      const float ax = x1 - x0;
      const float ay = y1 - y0;
      const float az = z1 - z0;
      const float bx = x2 - x0;
      const float by = y2 - y0;
      const float bz = z2 - z0;
      const float nx = ay * bz - az * by;
      const float ny = az * bx - ax * bz;
      const float nz = ax * by - ay * bx;
      const float length = (float)sqrt((double)(nx*nx + ny * ny + nz * nz));
      triangle_normals[t * 3] = length ? nx / length : nx;
      triangle_normals[t * 3 + 1] = length ? ny / length : ny;
      triangle_normals[t * 3 + 2] = length ? nz / length : nz;
      }
    }

  if (output_as_stl)
    {
    if (!trico_write_stl(vertices, tria_indices, nr_of_triangles, triangle_normals, attributes, new_filename))
      {
      printf("Could not write to %s\n", new_filename);
      return -1;
      }
    }
  else
    {
    if (!trico_write_ply(nr_of_vertices, vertices, vertex_normals, vertex_colors, nr_of_triangles, tria_indices, texcoords, new_filename))
      {
      printf("Could not write to %s\n", new_filename);
      return -1;
      }
    }
  
  free(vertices);
  free(triangle_normals);
  free(vertex_normals);
  free(vertex_colors);
  free(texcoords);
  free(tria_indices);
  free(attributes);
  return 0;
  }